

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseModuleCommand(WastParser *this,Script *script,CommandPtr *out_command)

{
  ScriptModuleType SVar1;
  undefined1 uVar3;
  undefined1 uVar5;
  undefined1 uVar8;
  undefined1 uVar12;
  WastParseOptions *pWVar2;
  undefined1 uVar6;
  undefined1 uVar9;
  undefined1 uVar13;
  undefined1 uVar16;
  undefined1 uVar17;
  pointer data;
  char *pcVar18;
  size_type sVar19;
  undefined8 uVar20;
  Command *pCVar21;
  pointer pEVar22;
  Result RVar23;
  TextScriptModule *pTVar24;
  DataScriptModule<(wabt::ScriptModuleType)1> *pDVar25;
  Module *out_module;
  pointer pEVar26;
  Command *pCVar27;
  Index IVar28;
  long lVar29;
  allocator local_c2;
  allocator local_c1;
  Command *local_c0;
  _Head_base<0UL,_wabt::ScriptModule_*,_false> local_b8;
  Module *local_b0;
  Command *local_a8;
  CommandPtr *local_a0;
  Errors errors;
  ReadBinaryOptions options;
  Index local_58 [8];
  undefined1 local_38 [8];
  undefined5 uVar4;
  undefined4 uVar7;
  undefined3 uVar10;
  undefined3 uVar11;
  undefined2 uVar14;
  undefined2 uVar15;
  
  local_b8._M_head_impl = (ScriptModule *)0x0;
  RVar23 = ParseScriptModule(this,(unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                                   *)&local_b8);
  if (RVar23.enum_ == Error) {
    RVar23.enum_ = Error;
  }
  else {
    MakeUnique<wabt::ModuleCommand>();
    pCVar27 = local_c0;
    SVar1 = (local_b8._M_head_impl)->type_;
    if (SVar1 == Quoted) {
      std::__cxx11::string::string((string *)&options,"a binary module",&local_c1);
      std::__cxx11::string::string((string *)local_58,"a text module",&local_c2);
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&errors,
                 &options,local_38);
      RVar23 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&errors,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&errors);
      lVar29 = 0x20;
      do {
        std::__cxx11::string::_M_dispose();
        lVar29 = lVar29 + -0x20;
      } while (lVar29 != -0x20);
    }
    else {
      out_module = (Module *)(local_c0 + 1);
      if (SVar1 == Binary) {
        local_a0 = out_command;
        pDVar25 = cast<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,wabt::ScriptModule>
                            (local_b8._M_head_impl);
        ReadBinaryOptions::ReadBinaryOptions(&options);
        pWVar2 = this->options_;
        uVar20._0_1_ = (pWVar2->features).exceptions_enabled_;
        uVar20._1_1_ = (pWVar2->features).mutable_globals_enabled_;
        uVar20._2_1_ = (pWVar2->features).sat_float_to_int_enabled_;
        uVar20._3_1_ = (pWVar2->features).sign_extension_enabled_;
        uVar5 = (pWVar2->features).simd_enabled_;
        uVar8 = (pWVar2->features).threads_enabled_;
        uVar12 = (pWVar2->features).multi_value_enabled_;
        uVar16 = (pWVar2->features).tail_call_enabled_;
        uVar14 = CONCAT11(uVar16,uVar12);
        uVar10 = CONCAT21(uVar14,uVar8);
        uVar20._4_4_ = CONCAT31(uVar10,uVar5);
        uVar3 = (pWVar2->features).bulk_memory_enabled_;
        uVar6 = (pWVar2->features).reference_types_enabled_;
        uVar9 = (pWVar2->features).annotations_enabled_;
        uVar13 = (pWVar2->features).gc_enabled_;
        uVar17 = (pWVar2->features).memory64_enabled_;
        uVar15 = CONCAT11(uVar17,uVar13);
        uVar11 = CONCAT21(uVar15,uVar9);
        uVar7 = CONCAT31(uVar11,uVar6);
        uVar4 = CONCAT41(uVar7,uVar3);
        options.features._8_4_ = SUB54(uVar4,0);
        options.features.memory64_enabled_ = (bool)uVar17;
        options.features._0_4_ = SUB84(uVar20,0);
        errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        data = (pDVar25->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
        options.features._4_4_ = uVar20._4_4_;
        ReadBinaryIr("<text>",data,
                     (long)(pDVar25->data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)data,&options,&errors,
                     out_module);
        local_a8 = pCVar27;
        std::__cxx11::string::_M_assign((string *)(pCVar27 + 3));
        pEVar22 = errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pcVar18 = (pDVar25->loc).filename.data_;
        sVar19 = (pDVar25->loc).filename.size_;
        uVar20 = *(undefined8 *)((long)&(pDVar25->loc).field_1 + 8);
        pCVar27[2]._vptr_Command = (_func_int **)(pDVar25->loc).field_1.field_1.offset;
        *(undefined8 *)&pCVar27[2].type = uVar20;
        (out_module->loc).filename.data_ = pcVar18;
        *(size_type *)&pCVar27[1].type = sVar19;
        local_b0 = out_module;
        for (pEVar26 = errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                       super__Vector_impl_data._M_start; pEVar26 != pEVar22; pEVar26 = pEVar26 + 1)
        {
          if (pEVar26->error_level != Error) {
            __assert_fail("error.error_level == ErrorLevel::Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/wast-parser.cc"
                          ,0xb63,
                          "Result wabt::WastParser::ParseModuleCommand(Script *, CommandPtr *)");
          }
          if ((pEVar26->loc).field_1.field_1.offset == 0xffffffffffffffff) {
            Error(this,0x2951c5,(pEVar26->message)._M_dataplus._M_p);
          }
          else {
            Error(this,0x2951e0);
          }
        }
        std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
        out_module = local_b0;
        out_command = local_a0;
        pCVar27 = local_a8;
      }
      else if (SVar1 == Text) {
        pTVar24 = cast<wabt::TextScriptModule,wabt::ScriptModule>(local_b8._M_head_impl);
        Module::operator=(out_module,&pTVar24->module);
      }
      if (script != (Script *)0x0) {
        IVar28 = (Index)((ulong)((long)(script->commands).
                                       super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(script->commands).
                                      super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3);
        if (*(long *)&pCVar27[3].type != 0) {
          options.features._0_4_ = *(undefined4 *)&(out_module->loc).filename.data_;
          options.features._4_4_ = *(undefined4 *)((long)&(out_module->loc).filename.data_ + 4);
          options.features._8_4_ = *(undefined4 *)&(out_module->loc).filename.size_;
          options._12_4_ = *(undefined4 *)((long)&(out_module->loc).filename.size_ + 4);
          options.log_stream._0_4_ = (out_module->loc).field_1.field_0.line;
          options.log_stream._4_4_ = (out_module->loc).field_1.field_0.first_column;
          options._24_4_ = (out_module->loc).field_1.field_0.last_column;
          options._28_4_ = *(undefined4 *)((long)&(out_module->loc).field_1 + 0xc);
          local_58[0] = IVar28;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
          ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                      *)&script->module_bindings,pCVar27 + 3);
        }
        this->last_module_index_ = IVar28;
      }
      pCVar21 = local_c0;
      local_c0 = (Command *)0x0;
      pCVar27 = (out_command->_M_t).
                super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
                super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
      super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar21;
      if (pCVar27 == (Command *)0x0) {
        RVar23.enum_ = Ok;
        goto LAB_0023ff3a;
      }
      (*pCVar27->_vptr_Command[1])();
      RVar23.enum_ = Ok;
    }
    if (local_c0 != (Command *)0x0) {
      (*local_c0->_vptr_Command[1])();
    }
  }
LAB_0023ff3a:
  if (local_b8._M_head_impl != (ScriptModule *)0x0) {
    (*(local_b8._M_head_impl)->_vptr_ScriptModule[1])();
  }
  return (Result)RVar23.enum_;
}

Assistant:

Result WastParser::ParseModuleCommand(Script* script, CommandPtr* out_command) {
  WABT_TRACE(ParseModuleCommand);
  std::unique_ptr<ScriptModule> script_module;
  CHECK_RESULT(ParseScriptModule(&script_module));

  auto command = MakeUnique<ModuleCommand>();
  Module& module = command->module;

  switch (script_module->type()) {
    case ScriptModuleType::Text:
      module = std::move(cast<TextScriptModule>(script_module.get())->module);
      break;

    case ScriptModuleType::Binary: {
      auto* bsm = cast<BinaryScriptModule>(script_module.get());
      ReadBinaryOptions options;
#if WABT_TRACING
      auto log_stream = FileStream::CreateStdout();
      options.log_stream = log_stream.get();
#endif
      options.features = options_->features;
      Errors errors;
      const char* filename = "<text>";
      ReadBinaryIr(filename, bsm->data.data(), bsm->data.size(), options,
                   &errors, &module);
      module.name = bsm->name;
      module.loc = bsm->loc;
      for (const auto& error: errors) {
        assert(error.error_level == ErrorLevel::Error);
        if (error.loc.offset == kInvalidOffset) {
          Error(bsm->loc, "error in binary module: %s", error.message.c_str());
        } else {
          Error(bsm->loc, "error in binary module: @0x%08" PRIzx ": %s",
                error.loc.offset, error.message.c_str());
        }
      }
      break;
    }

    case ScriptModuleType::Quoted:
      return ErrorExpected({"a binary module", "a text module"});
  }

  // script is nullptr when ParseModuleCommand is called from ParseModule.
  if (script) {
    Index command_index = script->commands.size();

    if (!module.name.empty()) {
      script->module_bindings.emplace(module.name,
                                      Binding(module.loc, command_index));
    }

    last_module_index_ = command_index;
  }

  *out_command = std::move(command);
  return Result::Ok;
}